

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceQuadTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner0,int inner1,int outer0,
          int outer1,int outer2,int outer3)

{
  int local_108;
  int local_100;
  Vector<float,_3> local_e8;
  int local_dc;
  int local_d8;
  int innerVtxX;
  int innerVtxY;
  float local_c8;
  int local_c4;
  float v_3;
  int i_3;
  float local_b4;
  int local_b0;
  float v_2;
  int i_2;
  float local_a0;
  int local_9c;
  float v_1;
  int i_1;
  float local_8c;
  int local_88;
  float v;
  int i;
  Vector<float,_3> local_74;
  Vector<float,_3> local_68 [2];
  Vector<float,_3> local_4c;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> tessCoords;
  int outer1_local;
  int outer0_local;
  int inner1_local;
  int inner0_local;
  SpacingMode spacingMode_local;
  
  tessCoords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = outer1;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  if ((inner0 == 1) || (inner1 == 1)) {
    if ((inner0 == 1) &&
       ((((inner1 == 1 && (outer0 == 1)) &&
         (tessCoords.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ == 1)) &&
        ((outer2 == 1 && (outer3 == 1)))))) {
      tcu::Vector<float,_3>::Vector(&local_4c,0.0,0.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 &local_4c);
      tcu::Vector<float,_3>::Vector(local_68,1.0,0.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 local_68);
      tcu::Vector<float,_3>::Vector(&local_74,0.0,1.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 &local_74);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&i,1.0,1.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&i);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (__return_storage_ptr__,
                 (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40)
      ;
    }
    else {
      local_100 = inner0;
      if ((inner0 < 2) && (local_100 = 2, spacingMode == SPACINGMODE_FRACTIONAL_ODD)) {
        local_100 = 3;
      }
      local_108 = inner1;
      if ((inner1 < 2) && (local_108 = 2, spacingMode == SPACINGMODE_FRACTIONAL_ODD)) {
        local_108 = 3;
      }
      generateReferenceQuadTessCoords
                (__return_storage_ptr__,spacingMode,local_100,local_108,outer0,
                 tessCoords.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,outer2,outer3);
    }
  }
  else {
    for (local_88 = 0; local_88 < outer0; local_88 = local_88 + 1) {
      local_8c = (float)local_88 / (float)outer0;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&v_1,0.0,local_8c,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&v_1);
    }
    for (local_9c = 0;
        local_9c <
        tessCoords.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_9c = local_9c + 1) {
      local_a0 = (float)local_9c /
                 (float)tessCoords.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&v_2,1.0 - local_a0,0.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&v_2);
    }
    for (local_b0 = 0; local_b0 < outer2; local_b0 = local_b0 + 1) {
      local_b4 = (float)local_b0 / (float)outer2;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&v_3,1.0,1.0 - local_b4,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&v_3);
    }
    for (local_c4 = 0; local_c4 < outer3; local_c4 = local_c4 + 1) {
      local_c8 = (float)local_c4 / (float)outer3;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&innerVtxX,local_c8,1.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&innerVtxX);
    }
    for (local_d8 = 0; local_d8 < inner1 + -1; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < inner0 + -1; local_dc = local_dc + 1) {
        tcu::Vector<float,_3>::Vector
                  (&local_e8,(float)(local_dc + 1) / (float)inner0,
                   (float)(local_d8 + 1) / (float)inner1,0.0);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   local_40,&local_e8);
      }
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (__return_storage_ptr__,
               (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  }
  v = 1.4013e-45;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceQuadTessCoords (const SpacingMode	spacingMode,
														const int			inner0,
														const int			inner1,
														const int			outer0,
														const int			outer1,
														const int			outer2,
														const int			outer3)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
		{
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 1.0f, 0.0f));
			return tessCoords;
		}
		else
			return generateReferenceQuadTessCoords(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																outer0, outer1, outer2, outer3);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 0.0f)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f, 0.0f)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(    1.0f, 1.0f - v, 0.0f)); }
		for (int i = 0; i < outer3; i++) { const float v = (float)i / (float)outer3; tessCoords.push_back(tcu::Vec3(       v,     1.0f, 0.0f)); }

		for (int innerVtxY = 0; innerVtxY < inner1-1; innerVtxY++)
		for (int innerVtxX = 0; innerVtxX < inner0-1; innerVtxX++)
			tessCoords.push_back(tcu::Vec3((float)(innerVtxX + 1) / (float)inner0,
										   (float)(innerVtxY + 1) / (float)inner1,
										   0.0f));

		return tessCoords;
	}
}